

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

int __thiscall QWizard::addPage(QWizard *this,QWizardPage *page)

{
  bool bVar1;
  int *piVar2;
  int theid;
  QWizardPrivate *d;
  QWizard *in_stack_00000028;
  QWizardPage *in_stack_000000c0;
  int in_stack_000000cc;
  uint in_stack_ffffffffffffffe0;
  int iVar3;
  
  d_func((QWizard *)0x7ba4b0);
  iVar3 = 0;
  bVar1 = QMap<int,_QWizardPage_*>::isEmpty
                    ((QMap<int,_QWizardPage_*> *)(ulong)in_stack_ffffffffffffffe0);
  if (!bVar1) {
    piVar2 = QMap<int,_QWizardPage_*>::lastKey
                       ((QMap<int,_QWizardPage_*> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
    iVar3 = *piVar2 + 1;
  }
  setPage(in_stack_00000028,in_stack_000000cc,in_stack_000000c0);
  return iVar3;
}

Assistant:

int QWizard::addPage(QWizardPage *page)
{
    Q_D(QWizard);
    int theid = 0;
    if (!d->pageMap.isEmpty())
        theid = d->pageMap.lastKey() + 1;
    setPage(theid, page);
    return theid;
}